

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeRecordCompareString(int nKey1,void *pKey1,UnpackedRecord *pPKey2)

{
  u8 uVar1;
  int iVar2;
  int iVar3;
  int local_44;
  int szHdr;
  int nStr;
  int nCmp;
  int res;
  int serial_type;
  u8 *aKey1;
  UnpackedRecord *pPKey2_local;
  void *pKey1_local;
  int nKey1_local;
  
  _res = (byte *)pKey1;
  aKey1 = (u8 *)pPKey2;
  pPKey2_local = (UnpackedRecord *)pKey1;
  pKey1_local._0_4_ = nKey1;
  if (*(byte *)((long)pKey1 + 1) < 0x80) {
    nCmp = (int)*(byte *)((long)pKey1 + 1);
  }
  else {
    sqlite3GetVarint32((uchar *)((long)pKey1 + 1),(u32 *)&nCmp);
  }
  if (nCmp < 0xc) {
    nStr = (int)(char)aKey1[0x14];
  }
  else if ((nCmp & 1U) == 0) {
    nStr = (int)(char)aKey1[0x15];
  }
  else {
    iVar2 = (nCmp + -0xc) / 2;
    if ((int)pKey1_local < (int)((uint)*_res + iVar2)) {
      iVar2 = sqlite3CorruptError(0x13bea);
      aKey1[0x13] = (u8)iVar2;
      return 0;
    }
    local_44 = iVar2;
    if (*(int *)(*(long *)(aKey1 + 8) + 0xc) < iVar2) {
      local_44 = *(int *)(*(long *)(aKey1 + 8) + 0xc);
    }
    iVar3 = memcmp(_res + (int)(uint)*_res,*(void **)(*(long *)(aKey1 + 8) + 0x10),(long)local_44);
    if (iVar3 == 0) {
      if (iVar2 == *(int *)(*(long *)(aKey1 + 8) + 0xc)) {
        if (*(ushort *)(aKey1 + 0x10) < 2) {
          nStr = (int)(char)aKey1[0x12];
          aKey1[0x16] = '\x01';
        }
        else {
          nStr = sqlite3VdbeRecordCompareWithSkip
                           ((int)pKey1_local,pPKey2_local,(UnpackedRecord *)aKey1,1);
        }
      }
      else {
        if (iVar2 - *(int *)(*(long *)(aKey1 + 8) + 0xc) < 1) {
          uVar1 = aKey1[0x14];
        }
        else {
          uVar1 = aKey1[0x15];
        }
        nStr = (int)(char)uVar1;
      }
    }
    else {
      if (iVar3 < 1) {
        uVar1 = aKey1[0x14];
      }
      else {
        uVar1 = aKey1[0x15];
      }
      nStr = (int)(char)uVar1;
    }
  }
  return nStr;
}

Assistant:

static int vdbeRecordCompareString(
  int nKey1, const void *pKey1, /* Left key */
  UnpackedRecord *pPKey2        /* Right key */
){
  const u8 *aKey1 = (const u8*)pKey1;
  int serial_type;
  int res;

  assert( pPKey2->aMem[0].flags & MEM_Str );
  vdbeAssertFieldCountWithinLimits(nKey1, pKey1, pPKey2->pKeyInfo);
  getVarint32(&aKey1[1], serial_type);
  if( serial_type<12 ){
    res = pPKey2->r1;      /* (pKey1/nKey1) is a number or a null */
  }else if( !(serial_type & 0x01) ){ 
    res = pPKey2->r2;      /* (pKey1/nKey1) is a blob */
  }else{
    int nCmp;
    int nStr;
    int szHdr = aKey1[0];

    nStr = (serial_type-12) / 2;
    if( (szHdr + nStr) > nKey1 ){
      pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
      return 0;    /* Corruption */
    }
    nCmp = MIN( pPKey2->aMem[0].n, nStr );
    res = memcmp(&aKey1[szHdr], pPKey2->aMem[0].z, nCmp);

    if( res==0 ){
      res = nStr - pPKey2->aMem[0].n;
      if( res==0 ){
        if( pPKey2->nField>1 ){
          res = sqlite3VdbeRecordCompareWithSkip(nKey1, pKey1, pPKey2, 1);
        }else{
          res = pPKey2->default_rc;
          pPKey2->eqSeen = 1;
        }
      }else if( res>0 ){
        res = pPKey2->r2;
      }else{
        res = pPKey2->r1;
      }
    }else if( res>0 ){
      res = pPKey2->r2;
    }else{
      res = pPKey2->r1;
    }
  }

  assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, res)
       || CORRUPT_DB
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  return res;
}